

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathCompExprPtr xmlXPathCtxtCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  xmlXPathParserContextPtr ctxt_00;
  xmlHashTablePtr pxVar1;
  undefined4 local_3c;
  xmlXPathContextPtr pxStack_38;
  int oldDepth;
  xmlXPathCompExprPtr comp;
  xmlXPathContextPtr tmpctxt;
  xmlXPathParserContextPtr pctxt;
  xmlChar *str_local;
  xmlXPathContextPtr ctxt_local;
  
  comp = (xmlXPathCompExprPtr)0x0;
  if (str == (xmlChar *)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else {
    xmlInitParser();
    str_local = (xmlChar *)ctxt;
    if ((ctxt == (xmlXPathContextPtr)0x0) &&
       (comp = (xmlXPathCompExprPtr)xmlXPathNewContext((xmlDocPtr)0x0), str_local = (xmlChar *)comp,
       (xmlXPathContextPtr)comp == (xmlXPathContextPtr)0x0)) {
      ctxt_local = (xmlXPathContextPtr)0x0;
    }
    else {
      ctxt_00 = xmlXPathNewParserContext(str,(xmlXPathContextPtr)str_local);
      if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
        if (comp != (xmlXPathCompExprPtr)0x0) {
          xmlXPathFreeContext((xmlXPathContextPtr)comp);
        }
        ctxt_local = (xmlXPathContextPtr)0x0;
      }
      else {
        local_3c = *(undefined4 *)(str_local + 0x170);
        xmlXPathCompileExpr(ctxt_00,1);
        *(undefined4 *)(str_local + 0x170) = local_3c;
        if (ctxt_00->error == 0) {
          if (*ctxt_00->cur == '\0') {
            pxStack_38 = (xmlXPathContextPtr)ctxt_00->comp;
            if ((1 < *(int *)&pxStack_38->doc) && (-1 < pxStack_38->nb_variables_unused)) {
              if (str_local != (xmlChar *)0x0) {
                local_3c = *(undefined4 *)(str_local + 0x170);
              }
              xmlXPathOptimizeExpression
                        (ctxt_00,(xmlXPathStepOpPtr)
                                 (&pxStack_38->node->_private +
                                 (long)pxStack_38->nb_variables_unused * 7));
              if (str_local != (xmlChar *)0x0) {
                *(undefined4 *)(str_local + 0x170) = local_3c;
              }
            }
            ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
          }
          else {
            xmlXPatherror(ctxt_00,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kiyolee[P]libxml2/xpath.c"
                          ,0x30a4,7);
            pxStack_38 = (xmlXPathContextPtr)0x0;
          }
          xmlXPathFreeParserContext(ctxt_00);
          if (comp != (xmlXPathCompExprPtr)0x0) {
            xmlXPathFreeContext((xmlXPathContextPtr)comp);
          }
          if (pxStack_38 != (xmlXPathContextPtr)0x0) {
            pxVar1 = (xmlHashTablePtr)xmlStrdup(str);
            pxStack_38->varHash = pxVar1;
          }
          ctxt_local = pxStack_38;
        }
        else {
          xmlXPathFreeParserContext(ctxt_00);
          if (comp != (xmlXPathCompExprPtr)0x0) {
            xmlXPathFreeContext((xmlXPathContextPtr)comp);
          }
          ctxt_local = (xmlXPathContextPtr)0x0;
        }
      }
    }
  }
  return (xmlXPathCompExprPtr)ctxt_local;
}

Assistant:

xmlXPathCompExprPtr
xmlXPathCtxtCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    xmlXPathParserContextPtr pctxt;
    xmlXPathContextPtr tmpctxt = NULL;
    xmlXPathCompExprPtr comp;
    int oldDepth = 0;

    if (str == NULL)
        return(NULL);

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt, str);
    if (comp != NULL)
        return(comp);
#endif

    xmlInitParser();

    /*
     * We need an xmlXPathContext for the depth check.
     */
    if (ctxt == NULL) {
        tmpctxt = xmlXPathNewContext(NULL);
        if (tmpctxt == NULL)
            return(NULL);
        ctxt = tmpctxt;
    }

    pctxt = xmlXPathNewParserContext(str, ctxt);
    if (pctxt == NULL) {
        if (tmpctxt != NULL)
            xmlXPathFreeContext(tmpctxt);
        return NULL;
    }

    oldDepth = ctxt->depth;
    xmlXPathCompileExpr(pctxt, 1);
    ctxt->depth = oldDepth;

    if( pctxt->error != XPATH_EXPRESSION_OK )
    {
        xmlXPathFreeParserContext(pctxt);
        if (tmpctxt != NULL)
            xmlXPathFreeContext(tmpctxt);
        return(NULL);
    }

    if (*pctxt->cur != 0) {
	/*
	 * aleksey: in some cases this line prints *second* error message
	 * (see bug #78858) and probably this should be fixed.
	 * However, we are not sure that all error messages are printed
	 * out in other places. It's not critical so we leave it as-is for now
	 */
	xmlXPatherror(pctxt, __FILE__, __LINE__, XPATH_EXPR_ERROR);
	comp = NULL;
    } else {
	comp = pctxt->comp;
	if ((comp->nbStep > 1) && (comp->last >= 0)) {
            if (ctxt != NULL)
                oldDepth = ctxt->depth;
	    xmlXPathOptimizeExpression(pctxt, &comp->steps[comp->last]);
            if (ctxt != NULL)
                ctxt->depth = oldDepth;
	}
	pctxt->comp = NULL;
    }
    xmlXPathFreeParserContext(pctxt);
    if (tmpctxt != NULL)
        xmlXPathFreeContext(tmpctxt);

    if (comp != NULL) {
	comp->expr = xmlStrdup(str);
    }
    return(comp);
}